

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::Encode(SilentAggregateSystem *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumAggregates);
  (*(this->m_AggTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AggTyp,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void SilentAggregateSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16NumAggregates
           << KDIS_STREAM m_AggTyp
           << m_ui16Padding;
}